

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O2

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkTEXS(CB3DMeshFileLoader *this)

{
  int iVar1;
  long lVar2;
  pointer pSVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar4;
  undefined4 extraout_var;
  char local_79;
  array<irr::scene::SB3dTexture> *local_78;
  SB3dTexture local_70;
  
  local_78 = &this->Textures;
  while( true ) {
    lVar2 = *(long *)&(this->super_IMeshLoader).field_0x10;
    iVar1 = *(int *)(lVar2 + -0xc);
    lVar2 = *(long *)(lVar2 + -8);
    iVar4 = (*this->B3DFile->_vptr_IReadFile[3])();
    if (iVar1 + lVar2 <= CONCAT44(extraout_var,iVar4)) break;
    local_70.Xscale = 0.0;
    local_70.Yscale = 0.0;
    local_70.Angle = 0.0;
    local_70._60_4_ = 0;
    local_70.Flags = 0;
    local_70.Blend = 0;
    local_70.Xpos = 0.0;
    local_70.Ypos = 0.0;
    local_70.TextureName.field_2._M_allocated_capacity = 0;
    local_70.TextureName.field_2._8_8_ = 0;
    local_70.TextureName._M_string_length = 0;
    local_70.TextureName._M_dataplus._M_p = (pointer)&local_70.TextureName.field_2;
    core::array<irr::scene::SB3dTexture>::push_back(local_78,&local_70);
    ::std::__cxx11::string::_M_dispose();
    pSVar3 = (this->Textures).m_data.
             super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    readString_abi_cxx11_(&local_70.TextureName,this);
    ::std::__cxx11::string::operator=((string *)(pSVar3 + -1),(string *)&local_70);
    ::std::__cxx11::string::_M_dispose();
    __first._M_current = pSVar3[-1].TextureName._M_dataplus._M_p;
    local_70.TextureName._M_dataplus._M_p._0_1_ = 0x5c;
    local_79 = '/';
    ::std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + pSVar3[-1].TextureName._M_string_length),
               (char *)&local_70,&local_79);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].Flags,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].Blend,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].Xpos,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].Ypos,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].Xscale,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].Yscale,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].Angle,4);
  }
  core::array<irr::scene::SB3dChunk>::erase
            ((array<irr::scene::SB3dChunk> *)&(this->super_IMeshLoader).field_0x8,
             (int)((ulong)(*(long *)&(this->super_IMeshLoader).field_0x10 -
                          *(long *)&(this->super_IMeshLoader).field_0x8) >> 4) - 1);
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkTEXS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkTEXS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		Textures.push_back(SB3dTexture());
		SB3dTexture &B3dTexture = Textures.getLast();

		B3dTexture.TextureName = readString();
		std::replace(B3dTexture.TextureName.begin(), B3dTexture.TextureName.end(), '\\', '/');
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Texture", B3dTexture.TextureName.c_str(), ELL_DEBUG);
#endif

		B3DFile->read(&B3dTexture.Flags, sizeof(s32));
		B3DFile->read(&B3dTexture.Blend, sizeof(s32));
#ifdef __BIG_ENDIAN__
		B3dTexture.Flags = os::Byteswap::byteswap(B3dTexture.Flags);
		B3dTexture.Blend = os::Byteswap::byteswap(B3dTexture.Blend);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Flags", core::stringc(B3dTexture.Flags).c_str(), ELL_DEBUG);
		os::Printer::log("Blend", core::stringc(B3dTexture.Blend).c_str(), ELL_DEBUG);
#endif
		readFloats(&B3dTexture.Xpos, 1);
		readFloats(&B3dTexture.Ypos, 1);
		readFloats(&B3dTexture.Xscale, 1);
		readFloats(&B3dTexture.Yscale, 1);
		readFloats(&B3dTexture.Angle, 1);
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}